

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cpp
# Opt level: O0

bool wallet::LoadWallets(WalletContext *context)

{
  WalletContext *pWVar1;
  bool bVar2;
  byte bVar3;
  string *database_00;
  DatabaseOptions *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<fs::path>,_bool> pVar4;
  runtime_error *e;
  string *name;
  UniValue *wallet;
  vector<UniValue,_std::allocator<UniValue>_> *__range2;
  Chain *chain;
  shared_ptr<wallet::CWallet> pwallet;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  DatabaseStatus status;
  iterator __end2;
  iterator __begin2;
  bilingual_str error;
  DatabaseOptions options;
  set<fs::path,_std::less<fs::path>,_std::allocator<fs::path>_> wallet_paths;
  UniValue *in_stack_fffffffffffffbd8;
  UniValue *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffbe8;
  undefined1 in_stack_fffffffffffffbef;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffc08;
  uint in_stack_fffffffffffffc0c;
  WalletContext *in_stack_fffffffffffffc10;
  WalletContext *in_stack_fffffffffffffc18;
  DatabaseOptions *in_stack_fffffffffffffc20;
  ConstevalStringLiteral in_stack_fffffffffffffc28;
  WalletContext *in_stack_fffffffffffffc38;
  ArgsManager *in_stack_fffffffffffffc40;
  uint local_348;
  byte local_31b;
  undefined1 local_319 [33];
  undefined1 local_2f8 [72];
  undefined1 local_2b0 [24];
  _Base_ptr local_298;
  byte local_290;
  undefined1 local_1c8 [96];
  undefined1 local_168 [32];
  undefined1 local_108;
  bilingual_str *local_f8;
  undefined1 local_d0;
  _Base_ptr local_8;
  
  local_8 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  pWVar1 = *(WalletContext **)in_RDI;
  std::set<fs::path,_std::less<fs::path>,_std::allocator<fs::path>_>::set
            ((set<fs::path,_std::less<fs::path>,_std::allocator<fs::path>_> *)
             in_stack_fffffffffffffbd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc28.lit,&in_stack_fffffffffffffc20->require_existing,
             (allocator<char> *)in_stack_fffffffffffffc18);
  (**(code **)((((string *)&pWVar1->chain)->_M_dataplus)._M_p + 0x178))
            (local_2b0,pWVar1,&stack0xffffffffffffffa8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbd8);
  std::allocator<char>::~allocator((allocator<char> *)(local_2f8 + 0x47));
  local_2f8._56_8_ =
       std::vector<UniValue,_std::allocator<UniValue>_>::begin
                 ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffffbe0);
  local_2f8._48_8_ =
       std::vector<UniValue,_std::allocator<UniValue>_>::end
                 ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffffbe0);
  local_348 = in_stack_fffffffffffffc0c;
  do {
    bVar2 = __gnu_cxx::operator==<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                      ((__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                        *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                       (__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                        *)in_stack_fffffffffffffbe0);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_348 = 2;
LAB_009bbf9d:
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                ((vector<UniValue,_std::allocator<UniValue>_> *)
                 CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8));
      if (local_348 == 2) {
        local_31b = 1;
      }
      std::set<fs::path,_std::less<fs::path>,_std::allocator<fs::path>_>::~set
                ((set<fs::path,_std::less<fs::path>,_std::allocator<fs::path>_> *)
                 in_stack_fffffffffffffbd8);
      if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_8) {
        return (bool)(local_31b & 1);
      }
      __stack_chk_fail();
    }
    __gnu_cxx::__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
    operator*((__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_> *)
              in_stack_fffffffffffffbd8);
    bVar2 = UniValue::isStr(in_stack_fffffffffffffbd8);
    if (!bVar2) {
      ::_(in_stack_fffffffffffffc28);
      (**(code **)((((string *)&pWVar1->chain)->_M_dataplus)._M_p + 0x138))
                (pWVar1,&stack0xffffffffffffff68);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffbd8);
      local_31b = 0;
      local_348 = 1;
      goto LAB_009bbf9d;
    }
    database_00 = UniValue::get_str_abi_cxx11_(in_stack_fffffffffffffbe0);
    fs::PathFromString((string *)CONCAT44(local_348,in_stack_fffffffffffffc08));
    pVar4 = std::set<fs::path,_std::less<fs::path>,_std::allocator<fs::path>_>::insert
                      ((set<fs::path,_std::less<fs::path>,_std::allocator<fs::path>_> *)
                       CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8),
                       (value_type *)in_stack_fffffffffffffbe0);
    local_2f8._32_8_ = pVar4.first._M_node;
    local_2f8[0x28] = pVar4.second;
    bVar3 = local_2f8[0x28] ^ 0xff;
    local_298 = (_Base_ptr)local_2f8._32_8_;
    local_290 = local_2f8[0x28];
    fs::path::~path((path *)in_stack_fffffffffffffbd8);
    if ((bVar3 & 1) == 0) {
      DatabaseOptions::DatabaseOptions((DatabaseOptions *)in_stack_fffffffffffffbd8);
      ReadDatabaseArgs(in_stack_fffffffffffffc40,(DatabaseOptions *)in_stack_fffffffffffffc38);
      local_108 = 1;
      local_d0 = 0;
      in_stack_fffffffffffffc40 = (ArgsManager *)&stack0xfffffffffffffeb8;
      bilingual_str::bilingual_str((bilingual_str *)in_stack_fffffffffffffbd8);
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::vector
                ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffffbd8)
      ;
      MakeWalletDatabase((string *)in_stack_fffffffffffffc28.lit,in_stack_fffffffffffffc20,
                         (DatabaseStatus *)in_stack_fffffffffffffc18,
                         (bilingual_str *)in_stack_fffffffffffffc10);
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                          *)in_stack_fffffffffffffbd8);
      if ((bVar2) || (local_2f8._28_4_ != 5)) {
        in_stack_fffffffffffffc38 = pWVar1;
        ::_(in_stack_fffffffffffffc28);
        (**(code **)((((string *)&in_stack_fffffffffffffc38->chain)->_M_dataplus)._M_p + 0x128))
                  (in_stack_fffffffffffffc38,local_168);
        bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffbd8);
        bVar2 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                            *)in_stack_fffffffffffffbd8);
        if (bVar2) {
          in_stack_fffffffffffffc20 = in_RDI;
          std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::
          unique_ptr((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                      *)in_stack_fffffffffffffbd8,
                     (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                      *)0x9bbbea);
          in_stack_fffffffffffffbd8 = (UniValue *)local_2f8;
          CWallet::Create((WalletContext *)(local_319 + 9),(string *)in_stack_fffffffffffffc20,
                          (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                           *)database_00,(uint64_t)(local_319 + 1),local_f8,
                          (vector<bilingual_str,_std::allocator<bilingual_str>_> *)
                          &stack0xfffffffffffffeb8);
          _GLOBAL__N_1::std::
          unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::
          ~unique_ptr((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8));
          in_stack_fffffffffffffc28.lit = (char *)database_00;
        }
        else {
          std::shared_ptr<wallet::CWallet>::shared_ptr
                    ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffffbd8,(nullptr_t)0x9bbc41);
        }
        bVar2 = std::vector<bilingual_str,_std::allocator<bilingual_str>_>::empty
                          ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)
                           CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8));
        if (!bVar2) {
          in_stack_fffffffffffffc18 = (WalletContext *)local_319;
          in_stack_fffffffffffffc10 = pWVar1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc28.lit,&in_stack_fffffffffffffc20->require_existing,
                     (allocator<char> *)in_stack_fffffffffffffc18);
          Untranslated((string *)in_stack_fffffffffffffc10);
          util::Join<std::vector<bilingual_str,std::allocator<bilingual_str>>,bilingual_str>
                    (in_stack_fffffffffffffbf0,
                     (bilingual_str *)CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8))
          ;
          (**(code **)((((string *)&in_stack_fffffffffffffc10->chain)->_M_dataplus)._M_p + 0x130))
                    (in_stack_fffffffffffffc10,local_1c8);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffbd8);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffbd8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffbd8);
          std::allocator<char>::~allocator((allocator<char> *)local_319);
        }
        bVar2 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)
                           in_stack_fffffffffffffbd8);
        if (bVar2) {
          NotifyWalletLoaded(in_stack_fffffffffffffc10,
                             (shared_ptr<wallet::CWallet> *)
                             CONCAT44(local_348,in_stack_fffffffffffffc08));
          AddWallet(in_stack_fffffffffffffc18,
                    (shared_ptr<wallet::CWallet> *)in_stack_fffffffffffffc10);
        }
        else {
          (**(code **)((((string *)&pWVar1->chain)->_M_dataplus)._M_p + 0x138))
                    (pWVar1,&stack0xfffffffffffffeb8);
          local_31b = 0;
        }
        local_348 = (uint)!bVar2;
        _GLOBAL__N_1::std::shared_ptr<wallet::CWallet>::~shared_ptr
                  ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffffbd8);
      }
      else {
        local_348 = 3;
      }
      _GLOBAL__N_1::std::
      unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
                ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *
                 )CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8));
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
                ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)
                 CONCAT17(in_stack_fffffffffffffbef,in_stack_fffffffffffffbe8));
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffbd8);
      DatabaseOptions::~DatabaseOptions((DatabaseOptions *)in_stack_fffffffffffffbd8);
      if ((local_348 != 0) && (local_348 != 3)) goto LAB_009bbf9d;
    }
    __gnu_cxx::__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
    operator++((__normal_iterator<UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_> *)
               in_stack_fffffffffffffbd8);
  } while( true );
}

Assistant:

bool LoadWallets(WalletContext& context)
{
    interfaces::Chain& chain = *context.chain;
    try {
        std::set<fs::path> wallet_paths;
        for (const auto& wallet : chain.getSettingsList("wallet")) {
            if (!wallet.isStr()) {
                chain.initError(_("Invalid value detected for '-wallet' or '-nowallet'. "
                                  "'-wallet' requires a string value, while '-nowallet' accepts only '1' to disable all wallets"));
                return false;
            }
            const auto& name = wallet.get_str();
            if (!wallet_paths.insert(fs::PathFromString(name)).second) {
                continue;
            }
            DatabaseOptions options;
            DatabaseStatus status;
            ReadDatabaseArgs(*context.args, options);
            options.require_existing = true;
            options.verify = false; // No need to verify, assuming verified earlier in VerifyWallets()
            bilingual_str error;
            std::vector<bilingual_str> warnings;
            std::unique_ptr<WalletDatabase> database = MakeWalletDatabase(name, options, status, error);
            if (!database && status == DatabaseStatus::FAILED_NOT_FOUND) {
                continue;
            }
            chain.initMessage(_("Loading wallet…").translated);
            std::shared_ptr<CWallet> pwallet = database ? CWallet::Create(context, name, std::move(database), options.create_flags, error, warnings) : nullptr;
            if (!warnings.empty()) chain.initWarning(Join(warnings, Untranslated("\n")));
            if (!pwallet) {
                chain.initError(error);
                return false;
            }

            NotifyWalletLoaded(context, pwallet);
            AddWallet(context, pwallet);
        }
        return true;
    } catch (const std::runtime_error& e) {
        chain.initError(Untranslated(e.what()));
        return false;
    }
}